

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ResultBuilder * __thiscall
Catch::ExpressionLhs<std::error_code_const&>::
captureExpression<(Catch::Internal::Operator)0,io::net::stream_errc>
          (ExpressionLhs<std::error_code_const&> *this,stream_errc *rhs)

{
  bool result;
  ResultBuilder *pRVar1;
  char *__s;
  allocator<char> local_89;
  string local_88;
  string local_68;
  string local_38;
  stream_errc *local_18;
  stream_errc *rhs_local;
  ExpressionLhs<const_std::error_code_&> *this_local;
  
  pRVar1 = *(ResultBuilder **)this;
  local_18 = rhs;
  rhs_local = (stream_errc *)this;
  result = Internal::compare<(Catch::Internal::Operator)0,std::error_code,io::net::stream_errc>
                     (*(error_code **)(this + 8),rhs);
  pRVar1 = ResultBuilder::setResultType(pRVar1,result);
  toString<std::error_code>(&local_38,*(error_code **)(this + 8));
  pRVar1 = ResultBuilder::setLhs(pRVar1,&local_38);
  toString<io::net::stream_errc>(&local_68,local_18);
  pRVar1 = ResultBuilder::setRhs(pRVar1,&local_68);
  __s = Internal::OperatorTraits<(Catch::Internal::Operator)0>::getName();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,__s,&local_89);
  pRVar1 = ResultBuilder::setOp(pRVar1,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_38);
  return pRVar1;
}

Assistant:

ResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_rb
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }